

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_router_interface.c
# Opt level: O0

dlep_router_if * dlep_router_add_interface(char *ifname)

{
  int iVar1;
  dlep_router_if *interface;
  char *ifname_local;
  
  ifname_local = (char *)dlep_router_get_by_layer2_if(ifname);
  if ((dlep_router_if *)ifname_local == (dlep_router_if *)0x0) {
    ifname_local = (char *)oonf_class_malloc(&_router_if_class);
    if ((dlep_if *)ifname_local == (dlep_if *)0x0) {
      ifname_local = (char *)0x0;
    }
    else {
      iVar1 = dlep_if_add((dlep_if *)ifname_local,ifname,&_l2_origin,&_l2_default_origin,
                          _connect_to_if_changed,LOG_DLEP_ROUTER,false);
      if (iVar1 == 0) {
        *(oonf_timer_class **)
         &(((dlep_if *)((long)ifname_local + 0xbb0))->session).writer.signal_type =
             &_connect_to_watchdog_class;
        if (((&log_global_mask)[LOG_DLEP_ROUTER] & 1) != 0) {
          oonf_log(1,LOG_DLEP_ROUTER,"src/generic/dlep/router/dlep_router_interface.c",0xd5,0,0,
                   "Add session %s",ifname);
        }
      }
      else {
        oonf_class_free(&_router_if_class,ifname_local);
        ifname_local = (char *)0x0;
      }
    }
  }
  else if (((&log_global_mask)[LOG_DLEP_ROUTER] & 1) != 0) {
    oonf_log(1,LOG_DLEP_ROUTER,"src/generic/dlep/router/dlep_router_interface.c",0xc4,0,0,
             "use existing instance for %s",ifname);
  }
  return (dlep_router_if *)ifname_local;
}

Assistant:

struct dlep_router_if *
dlep_router_add_interface(const char *ifname) {
  struct dlep_router_if *interface;

  interface = dlep_router_get_by_layer2_if(ifname);
  if (interface) {
    OONF_DEBUG(LOG_DLEP_ROUTER, "use existing instance for %s", ifname);
    return interface;
  }

  interface = oonf_class_malloc(&_router_if_class);
  if (!interface) {
    return NULL;
  }

  if (dlep_if_add(&interface->interf, ifname, &_l2_origin, &_l2_default_origin, _connect_to_if_changed, LOG_DLEP_ROUTER, false)) {
    oonf_class_free(&_router_if_class, interface);
    return NULL;
  }

  /* prepare timer */
  interface->_connect_to_watchdog.class = &_connect_to_watchdog_class;

  OONF_DEBUG(LOG_DLEP_ROUTER, "Add session %s", ifname);
  return interface;
}